

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O3

DynamicObject * __thiscall
Js::LazyJSONString::ReconstructObject(LazyJSONString *this,JSONObject *valueList)

{
  RecyclableObject *pRVar1;
  JavascriptString *obj;
  code *pcVar2;
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *pSVar3;
  bool bVar4;
  DynamicObject *object;
  undefined4 *puVar5;
  Type *pTVar6;
  Var propertyValue;
  PropertyString *this_00;
  undefined1 local_90 [8];
  PropertyValueInfo info;
  PropertyRecord *localPropertyRecord;
  Iterator local_40;
  
  object = JavascriptLibrary::CreateObject
                     ((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->
                      javascriptLibrary).ptr,true,
                      (PropertyIndex)
                      (valueList->super_SList<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>).
                      super_SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>.
                      super_RealCount.count);
  local_40.list = (SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)valueList;
  local_40.current = (NodeBase *)valueList;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  while( true ) {
    if ((RecyclableObject *)valueList == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      valueList = (JSONObject *)local_40.current;
    }
    pSVar3 = local_40.list;
    pRVar1 = (RecyclableObject *)
             (((SList<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)
              &((RecyclableObject *)valueList)->super_FinalizableObject)->
             super_SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>).
             super_SListNodeBase<Memory::Recycler>.next.ptr;
    Memory::Recycler::WBSetBit((char *)local_90);
    local_90 = (undefined1  [8])pRVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier((PropertyValueInfo *)local_90);
    if (local_90 == (undefined1  [8])pSVar3) break;
    pRVar1 = (RecyclableObject *)
             (((SList<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)
              &(local_40.current)->next)->
             super_SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>).
             super_SListNodeBase<Memory::Recycler>.next.ptr;
    Memory::Recycler::WBSetBit((char *)local_90);
    local_90 = (undefined1  [8])pRVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier((PropertyValueInfo *)local_90);
    local_40.current = (NodeBase *)local_90;
    pTVar6 = SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>::Iterator::Data
                       (&local_40);
    propertyValue = ReconstructVar(this,&pTVar6->propertyValue);
    obj = (pTVar6->propertyName).ptr;
    bVar4 = VarIsImpl<Js::PropertyString>(&obj->super_RecyclableObject);
    if (bVar4) {
      this_00 = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>(obj);
    }
    else {
      this_00 = (PropertyString *)0x0;
    }
    local_90 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.prop = (RecyclableObject *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    if ((this_00 == (PropertyString *)0x0) ||
       (bVar4 = PropertyString::TrySetPropertyFromCache
                          (this_00,&object->super_RecyclableObject,propertyValue,
                           (((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->
                             javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
                           ,PropertyOperation_None,(PropertyValueInfo *)local_90),
       valueList = (JSONObject *)local_40.current, !bVar4)) {
      (*(obj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x61])(obj,&info.inlineCacheIndex,0);
      JavascriptOperators::SetProperty
                (object,&object->super_RecyclableObject,*(PropertyId *)(info._56_8_ + 8),
                 propertyValue,(PropertyValueInfo *)local_90,
                 (((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->
                   javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,
                 PropertyOperation_None);
      valueList = (JSONObject *)local_40.current;
    }
  }
  return object;
}

Assistant:

DynamicObject*
LazyJSONString::ReconstructObject(_In_ JSONObject* valueList) const
{
    const uint elementCount = valueList->Count();

    // This is just a heuristic, so overflow doesn't matter
    PropertyIndex requestedInlineSlotCapacity = static_cast<PropertyIndex>(elementCount);

    DynamicObject* obj = this->GetLibrary()->CreateObject(
        true, // allowObjectHeaderInlining
        requestedInlineSlotCapacity);

    FOREACH_SLISTCOUNTED_ENTRY(JSONObjectProperty, entry, valueList)
    {
        Var propertyValue = ReconstructVar(&entry.propertyValue);
        JavascriptString* propertyName = entry.propertyName;
        PropertyString* propertyString = JavascriptOperators::TryFromVar<PropertyString>(propertyName);
        PropertyValueInfo info;
        if (!propertyString || !propertyString->TrySetPropertyFromCache(obj, propertyValue, this->GetScriptContext(), PropertyOperation_None, &info))
        {
            Js::PropertyRecord const * localPropertyRecord;
            propertyName->GetPropertyRecord(&localPropertyRecord);
            JavascriptOperators::SetProperty(obj, obj, localPropertyRecord->GetPropertyId(),
                propertyValue, &info, this->GetScriptContext());
        }
    }
    NEXT_SLISTCOUNTED_ENTRY;
    return obj;
}